

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap2Local.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_22::Struct2Local::visitStructSet(Struct2Local *this,StructSet *curr)

{
  ParentChildInteraction PVar1;
  Drop *left;
  reference pvVar2;
  LocalSet *right;
  optional<wasm::Type> type;
  optional<wasm::Type> local_30;
  Block *local_20;
  Block *replacement;
  StructSet *curr_local;
  Struct2Local *this_local;
  
  replacement = (Block *)curr;
  curr_local = (StructSet *)this;
  PVar1 = EscapeAnalyzer::getInteraction(this->analyzer,(Expression *)curr);
  if (PVar1 != None) {
    left = Builder::makeDrop(&this->builder,
                             (Expression *)(replacement->name).super_IString.str._M_str);
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->localIndexes,
                        (ulong)(uint)(replacement->name).super_IString.str._M_len);
    right = Builder::makeLocalSet
                      (&this->builder,*pvVar2,
                       (Expression *)
                       (replacement->list).
                       super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                       data);
    std::optional<wasm::Type>::optional(&local_30);
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._9_7_ = 0;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload =
         local_30.super__Optional_base<wasm::Type,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Type>._M_payload;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_engaged =
         local_30.super__Optional_base<wasm::Type,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Type>._M_engaged;
    local_20 = Builder::makeSequence(&this->builder,(Expression *)left,(Expression *)right,type);
    replaceCurrent(this,(Expression *)local_20);
  }
  return;
}

Assistant:

void visitStructSet(StructSet* curr) {
    if (analyzer.getInteraction(curr) == ParentChildInteraction::None) {
      return;
    }

    // Drop the ref (leaving it to other opts to remove, when possible), and
    // write the data to the local instead of the heap allocation.
    auto* replacement = builder.makeSequence(
      builder.makeDrop(curr->ref),
      builder.makeLocalSet(localIndexes[curr->index], curr->value));

    // This struct.set cannot possibly synchronize with other threads via the
    // read value, since the struct never escapes this function, so we don't
    // need a fence.
    replaceCurrent(replacement);
  }